

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error TT_Vary_Apply_Glyph_Deltas(TT_Loader loader,FT_Outline *outline,FT_Vector *unrounded)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  ushort uVar5;
  FT_ULong pos;
  FT_UInt delta_cnt;
  undefined8 uVar6;
  FT_Pos FVar7;
  FT_Stream pFVar8;
  GX_Blend pGVar9;
  FT_UInt16 FVar10;
  FT_UInt16 FVar11;
  long lVar12;
  FT_Vector *pFVar13;
  FT_Vector *P;
  uchar *puVar14;
  ulong uVar15;
  FT_Fixed *pFVar16;
  undefined1 *puVar17;
  uchar *puVar18;
  FT_Memory pFVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  FT_Pos *pFVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  FT_UShort *pFVar28;
  ulong uVar29;
  long lVar30;
  FT_Error error;
  FT_UShort *local_160;
  FT_Memory local_158;
  FT_Vector *local_150;
  FT_Stream local_148;
  FT_Vector *local_140;
  GX_Blend local_138;
  undefined1 *local_130;
  FT_Pointer local_128;
  FT_UInt16 local_11a;
  FT_Pointer local_118;
  ulong local_110;
  long local_108;
  FT_Fixed *local_100;
  ulong local_f8;
  ulong local_f0;
  int local_e8;
  FT_UInt local_e4;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_UShort *local_d8;
  long local_d0;
  ulong local_c8;
  FT_Fixed *local_c0;
  FT_Fixed *local_b8;
  ulong local_b0;
  FT_UShort *local_a8;
  FT_Fixed *local_a0;
  FT_Fixed *local_98;
  FT_Pos *local_90;
  long local_88;
  long local_80;
  ulong local_78;
  TT_Loader local_70;
  TT_Face local_68;
  FT_Pos *local_60;
  uchar *local_58;
  uchar *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_68 = loader->face;
  local_148 = (local_68->root).stream;
  local_158 = local_148->memory;
  uVar25 = loader->glyph_index;
  local_f0 = (ulong)(uint)(int)outline->n_points;
  local_138 = local_68->blend;
  spoint_count = 0;
  if (local_138 == (GX_Blend)0x0 || local_68->doblend == '\0') {
    return 6;
  }
  local_e4 = (int)outline->n_points + 4;
  uVar21 = (ulong)local_e4;
  lVar24 = uVar21 << 4;
  for (lVar12 = 0; lVar24 != lVar12; lVar12 = lVar12 + 0x10) {
    plVar4 = (long *)((long)&outline->points->x + lVar12);
    lVar26 = plVar4[1];
    plVar1 = (long *)((long)&unrounded->x + lVar12);
    *plVar1 = *plVar4 << 6;
    plVar1[1] = lVar26 << 6;
  }
  if (local_138->gv_glyphcnt <= uVar25) {
    return 0;
  }
  if (local_138->glyphoffsets[uVar25] == local_138->glyphoffsets[(ulong)uVar25 + 1]) {
    return 0;
  }
  local_130 = (undefined1 *)0x0;
  local_70 = loader;
  pFVar13 = (FT_Vector *)ft_mem_realloc(local_158,0x10,0,uVar21,(void *)0x0,&error);
  pFVar19 = local_158;
  P = (FT_Vector *)0x0;
  if (error != 0) goto LAB_0021b2f4;
  local_150 = pFVar13;
  P = (FT_Vector *)ft_mem_realloc(local_158,0x10,0,uVar21,(void *)0x0,&error);
  if (error != 0) {
    local_130 = (undefined1 *)0x0;
    pFVar13 = local_150;
    goto LAB_0021b2f4;
  }
  local_140 = P;
  local_130 = (undefined1 *)ft_mem_realloc(pFVar19,1,0,uVar21,(void *)0x0,&error);
  pGVar9 = local_138;
  pFVar8 = local_148;
  pFVar13 = local_150;
  pFVar19 = local_158;
  P = local_140;
  if (error != 0) goto LAB_0021b2f4;
  local_160 = (FT_UShort *)local_138->glyphoffsets[(ulong)uVar25 + 1];
  pos = local_138->glyphoffsets[uVar25];
  local_b0 = uVar21;
  error = FT_Stream_Seek(local_148,pos);
  pFVar13 = local_150;
  pFVar19 = local_158;
  P = local_140;
  if (error != 0) goto LAB_0021b2f4;
  pFVar28 = (FT_UShort *)((long)local_160 - pos);
  error = FT_Stream_EnterFrame(pFVar8,(FT_ULong)pFVar28);
  pFVar19 = local_158;
  pFVar13 = local_150;
  P = local_140;
  if (error != 0) goto LAB_0021b2f4;
  local_f8 = (long)pFVar8->cursor - (long)pFVar8->base;
  local_b8 = (FT_Fixed *)0x0;
  local_160 = pFVar28;
  local_c0 = (FT_Fixed *)ft_mem_realloc(local_158,8,0,(ulong)pGVar9->num_axis,(void *)0x0,&error);
  pFVar16 = (FT_Fixed *)0x0;
  pFVar28 = (FT_UShort *)0x0;
  if (error == 0) {
    local_b8 = (FT_Fixed *)ft_mem_realloc(pFVar19,8,0,(ulong)pGVar9->num_axis,(void *)0x0,&error);
    if (error != 0) {
      pFVar16 = (FT_Fixed *)0x0;
      pFVar28 = (FT_UShort *)0x0;
      goto LAB_0021b2a0;
    }
    local_100 = (FT_Fixed *)ft_mem_realloc(local_158,8,0,(ulong)pGVar9->num_axis,(void *)0x0,&error)
    ;
    pFVar8 = local_148;
    if (error != 0) {
      pFVar16 = local_100;
      pFVar28 = (FT_UShort *)0x0;
      goto LAB_0021b2a0;
    }
    FVar10 = FT_Stream_GetUShort(local_148);
    FVar11 = FT_Stream_GetUShort(pFVar8);
    pFVar8 = local_148;
    if ((local_160 < (FT_UShort *)(ulong)FVar11) ||
       (local_48 = (ulong)(FVar10 & 0xfff), local_160 < (FT_UShort *)(ulong)((FVar10 & 0xfff) * 4)))
    {
      error = 8;
      pFVar16 = local_100;
      pFVar28 = (FT_UShort *)0x0;
      goto LAB_0021b2a0;
    }
    local_f8 = local_f8 + (long)(ulong)FVar11;
    if ((short)FVar10 < 0) {
      puVar18 = local_148->base;
      uVar21 = (long)local_148->cursor - (long)puVar18;
      puVar14 = puVar18 + local_f8;
      if ((ulong)((long)local_148->limit - (long)puVar18) <= local_f8) {
        puVar14 = local_148->limit;
      }
      local_148->cursor = puVar14;
      local_a8 = ft_var_readpackedpoints(local_148,local_138->gvar_size,&spoint_count);
      puVar18 = pFVar8->base;
      local_f8 = (long)pFVar8->cursor - (long)puVar18;
      puVar14 = puVar18 + uVar21;
      if ((ulong)((long)pFVar8->limit - (long)puVar18) <= uVar21) {
        puVar14 = pFVar8->limit;
      }
      pFVar8->cursor = puVar14;
    }
    else {
      local_a8 = (FT_UShort *)0x0;
    }
    local_128 = (FT_Pointer)0x0;
    local_118 = ft_mem_realloc(local_158,8,0,local_b0,(void *)0x0,&error);
    if ((error == 0) &&
       (local_128 = ft_mem_realloc(local_158,8,0,local_b0,(void *)0x0,&error), error == 0)) {
      for (lVar12 = 0; lVar24 != lVar12; lVar12 = lVar12 + 0x10) {
        plVar4 = (long *)((long)&outline->points->x + lVar12);
        lVar26 = plVar4[1];
        plVar1 = (long *)((long)&local_150->x + lVar12);
        *plVar1 = *plVar4 << 0x10;
        plVar1[1] = lVar26 << 0x10;
      }
      local_90 = &local_140->y;
      local_60 = &local_140[1].y;
      local_88 = local_b0 * 8;
      local_d8 = (FT_UShort *)0x0;
      for (local_e8 = 0; pFVar8 = local_148, local_e8 != (int)local_48; local_e8 = local_e8 + 1) {
        local_11a = FT_Stream_GetUShort(local_148);
        FVar10 = FT_Stream_GetUShort(pFVar8);
        pFVar16 = local_c0;
        local_160 = (FT_UShort *)CONCAT44(local_160._4_4_,(uint)FVar10);
        if ((short)FVar10 < 0) {
          for (uVar21 = 0; uVar21 < local_138->num_axis; uVar21 = uVar21 + 1) {
            FVar10 = FT_Stream_GetUShort(local_148);
            pFVar16[uVar21] = (long)(short)FVar10 << 2;
          }
        }
        else {
          uVar25 = FVar10 & 0xfff;
          if (local_138->tuplecount <= uVar25) {
            error = 8;
            goto LAB_0021b424;
          }
          memcpy(local_c0,local_138->tuplecoords + uVar25 * local_138->num_axis,
                 (ulong)local_138->num_axis << 3);
        }
        pFVar16 = local_b8;
        if (((uint)local_160 >> 0xe & 1) != 0) {
          for (uVar21 = 0; uVar15 = (ulong)local_138->num_axis, uVar21 < uVar15; uVar21 = uVar21 + 1
              ) {
            FVar10 = FT_Stream_GetUShort(local_148);
            pFVar16[uVar21] = (long)(short)FVar10 << 2;
          }
          for (uVar21 = 0; uVar21 < uVar15; uVar21 = uVar21 + 1) {
            FVar10 = FT_Stream_GetUShort(local_148);
            local_100[uVar21] = (long)(short)FVar10 << 2;
            uVar15 = (ulong)local_138->num_axis;
          }
        }
        local_108 = ft_var_apply_tuple(local_138,(FT_UShort)local_160,local_c0,local_b8,local_100);
        if (local_108 != 0) {
          local_58 = local_148->base;
          local_50 = local_148->cursor;
          puVar18 = local_58 + local_f8;
          if ((ulong)((long)local_148->limit - (long)local_58) <= local_f8) {
            puVar18 = local_148->limit;
          }
          local_148->cursor = puVar18;
          if (((uint)local_160 >> 0xd & 1) == 0) {
            local_110 = CONCAT44(local_110._4_4_,spoint_count);
            point_count = spoint_count;
            local_160 = local_a8;
          }
          else {
            local_160 = ft_var_readpackedpoints(local_148,local_138->gvar_size,&point_count);
            local_110 = CONCAT44(local_110._4_4_,point_count);
            local_d8 = local_160;
          }
          pGVar9 = local_138;
          pFVar8 = local_148;
          delta_cnt = (FT_UInt)local_110;
          if ((FT_UInt)local_110 == 0) {
            delta_cnt = local_e4;
          }
          pFVar16 = ft_var_readpackeddeltas(local_148,local_138->gvar_size,delta_cnt);
          local_a0 = ft_var_readpackeddeltas(pFVar8,pGVar9->gvar_size,delta_cnt);
          local_98 = pFVar16;
          if (((local_160 != (FT_UShort *)0x0) && (local_a0 != (FT_Fixed *)0x0)) &&
             (pFVar16 != (FT_Fixed *)0x0)) {
            if (local_160 == (FT_UShort *)0xffffffffffffffff) {
              for (uVar21 = 0; local_b0 != uVar21; uVar21 = uVar21 + 1) {
                lVar26 = (long)(int)pFVar16[uVar21] * (long)(int)local_108;
                lVar27 = (long)(int)local_a0[uVar21] * (long)(int)local_108;
                lVar12 = *(long *)((long)local_128 + uVar21 * 8);
                plVar4 = (long *)((long)local_118 + uVar21 * 8);
                *plVar4 = *plVar4 + (long)(int)((ulong)(lVar26 + 0x8000 + (lVar26 >> 0x3f)) >> 0x10)
                ;
                *(long *)((long)local_128 + uVar21 * 8) =
                     (int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) + lVar12;
              }
            }
            else {
              puVar17 = local_130;
              for (lVar12 = 0; lVar24 != lVar12; lVar12 = lVar12 + 0x10) {
                *puVar17 = 0;
                puVar2 = (undefined8 *)((long)&local_150->x + lVar12);
                uVar6 = puVar2[1];
                puVar3 = (undefined8 *)((long)&local_140->x + lVar12);
                *puVar3 = *puVar2;
                puVar3[1] = uVar6;
                puVar17 = puVar17 + 1;
              }
              for (uVar21 = 0; (local_110 & 0xffffffff) != uVar21; uVar21 = uVar21 + 1) {
                uVar5 = local_160[uVar21];
                if (uVar5 < local_e4) {
                  local_130[uVar5] = 1;
                  lVar12 = (long)(int)pFVar16[uVar21] * (long)(int)local_108;
                  local_140[uVar5].x =
                       local_140[uVar5].x +
                       (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
                  lVar12 = (long)(int)local_a0[uVar21] * (long)(int)local_108;
                  local_140[uVar5].y =
                       local_140[uVar5].y +
                       (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
                }
              }
              if (outline->n_contours != 0) {
                lVar12 = 0;
                uVar21 = 0;
                puVar17 = local_130;
                do {
                  pFVar28 = (FT_UShort *)(long)outline->contours[lVar12];
                  lVar27 = (long)(int)uVar21;
                  lVar26 = (long)pFVar28 + 1;
                  if ((long)pFVar28 + 1 <= lVar27) {
                    lVar26 = lVar27;
                  }
                  uVar25 = (uint)lVar26;
                  lVar26 = lVar27 << 0x20;
                  lVar30 = 0;
LAB_0021b832:
                  uVar15 = lVar27 + lVar30;
                  if ((long)uVar15 <= (long)pFVar28) {
                    if (puVar17[lVar30 + lVar27] == '\0') goto code_r0x0021b846;
                    local_108 = uVar21 + lVar30;
                    uVar22 = uVar15 & 0xffffffff;
                    uVar29 = uVar15;
                    local_160 = pFVar28;
                    local_110 = uVar21;
                    local_d0 = lVar12;
                    local_80 = lVar26;
                    local_40 = lVar27;
                    local_38 = uVar21;
                    while (iVar20 = (int)uVar22, (long)uVar29 < (long)pFVar28) {
                      uVar21 = uVar29 + 1;
                      lVar12 = uVar29 + 1;
                      uVar29 = uVar21;
                      if (puVar17[lVar12] != '\0') {
                        tt_delta_interpolate
                                  (iVar20 + 1,(int)uVar21 + -1,iVar20,(int)uVar21,local_150,
                                   local_140);
                        uVar22 = uVar21 & 0xffffffff;
                        pFVar28 = local_160;
                        puVar17 = local_130;
                      }
                    }
                    local_c8 = (ulong)((int)uVar29 + 1);
                    local_78 = uVar22;
                    if ((int)lVar30 + ((int)local_110 - iVar20) == 0) {
                      lVar27 = local_80 >> 0x1c;
                      lVar12 = *(long *)((long)&local_140->y + lVar27);
                      lVar26 = *(long *)((long)&local_150->y + lVar27);
                      lVar27 = *(long *)((long)&local_140->x + lVar27) -
                               *(long *)((long)&local_150->x + lVar27);
                      if ((lVar27 != 0) || (lVar12 != lVar26)) {
                        lVar30 = local_80 >> 0x20;
                        lVar12 = lVar12 - lVar26;
                        pFVar23 = local_90 + local_40 * 2;
                        for (lVar26 = local_40; lVar26 < lVar30; lVar26 = lVar26 + 1) {
                          ((FT_Vector *)(pFVar23 + -1))->x =
                               ((FT_Vector *)(pFVar23 + -1))->x + lVar27;
                          *pFVar23 = *pFVar23 + lVar12;
                          pFVar23 = pFVar23 + 2;
                        }
                        pFVar23 = local_60 + lVar30 * 2;
                        for (; lVar30 < (long)local_160; lVar30 = lVar30 + 1) {
                          ((FT_Vector *)(pFVar23 + -1))->x =
                               ((FT_Vector *)(pFVar23 + -1))->x + lVar27;
                          *pFVar23 = *pFVar23 + lVar12;
                          pFVar23 = pFVar23 + 2;
                        }
                      }
                    }
                    else {
                      tt_delta_interpolate
                                (iVar20 + 1,(int)local_160,iVar20,(int)local_108,local_150,local_140
                                );
                      if (0 < (long)uVar15) {
                        tt_delta_interpolate
                                  ((int)local_110,(int)local_38 + (int)lVar30 + -1,(int)local_78,
                                   (int)local_108,local_150,local_140);
                      }
                    }
                    uVar25 = (uint)local_c8;
                    puVar17 = local_130;
                    lVar12 = local_d0;
                  }
                  lVar12 = lVar12 + 1;
                  uVar21 = (ulong)uVar25;
                  if (outline->n_contours <= lVar12) break;
                } while( true );
              }
              for (lVar12 = 0; local_88 != lVar12; lVar12 = lVar12 + 8) {
                lVar26 = *(long *)((long)local_90 + lVar12 * 2);
                lVar27 = *(long *)((long)local_128 + lVar12);
                lVar30 = *(long *)((long)&local_150->y + lVar12 * 2);
                *(long *)((long)local_118 + lVar12) =
                     (*(long *)((long)local_90 + lVar12 * 2 + -8) +
                     *(long *)((long)local_118 + lVar12)) -
                     *(long *)((long)&local_150->x + lVar12 * 2);
                *(long *)((long)local_128 + lVar12) = (lVar26 + lVar27) - lVar30;
              }
            }
          }
          pFVar28 = (FT_UShort *)0xffffffffffffffff;
          if (local_d8 != (FT_UShort *)0xffffffffffffffff) {
            ft_mem_free(local_158,local_d8);
            pFVar28 = (FT_UShort *)0x0;
          }
          pFVar19 = local_158;
          uVar21 = (long)local_50 - (long)local_58;
          ft_mem_free(local_158,local_98);
          ft_mem_free(pFVar19,local_a0);
          puVar18 = local_148->base + uVar21;
          if ((ulong)((long)local_148->limit - (long)local_148->base) <= uVar21) {
            puVar18 = local_148->limit;
          }
          local_148->cursor = puVar18;
          local_d8 = pFVar28;
        }
        local_f8 = local_f8 + local_11a;
      }
      uVar25 = local_68->variation_support;
      uVar21 = local_f0 & 0xffffffff;
      iVar20 = (int)local_f0;
      if ((uVar25 & 2) != 0) {
        *(undefined8 *)((long)local_118 + uVar21 * 8) = 0;
        *(undefined8 *)((long)local_128 + uVar21 * 8) = 0;
        *(undefined8 *)((long)local_118 + (ulong)(iVar20 + 1) * 8) = 0;
        *(undefined8 *)((long)local_128 + (ulong)(iVar20 + 1) * 8) = 0;
      }
      if ((uVar25 & 0x10) != 0) {
        *(undefined8 *)((long)local_118 + (ulong)(iVar20 + 2) * 8) = 0;
        *(undefined8 *)((long)local_128 + (ulong)(iVar20 + 2) * 8) = 0;
        *(undefined8 *)((long)local_118 + (ulong)(iVar20 + 3) * 8) = 0;
        *(undefined8 *)((long)local_128 + (ulong)(iVar20 + 3) * 8) = 0;
      }
      for (lVar12 = 0; local_88 != lVar12; lVar12 = lVar12 + 8) {
        plVar4 = (long *)((long)&unrounded->x + lVar12 * 2);
        *plVar4 = *plVar4 + (*(long *)((long)local_118 + lVar12) + 0x200 >> 10);
        plVar4 = (long *)((long)&unrounded->y + lVar12 * 2);
        *plVar4 = *plVar4 + (*(long *)((long)local_128 + lVar12) + 0x200 >> 10);
        pFVar13 = outline->points;
        plVar4 = (long *)((long)&pFVar13->x + lVar12 * 2);
        *plVar4 = *plVar4 + ((*(long *)((long)local_118 + lVar12) << 0x20) + 0x800000000000 >> 0x30)
        ;
        plVar4 = (long *)((long)&pFVar13->y + lVar12 * 2);
        *plVar4 = *plVar4 + ((*(long *)((long)local_128 + lVar12) << 0x20) + 0x800000000000 >> 0x30)
        ;
      }
      if ((uVar25 & 2) == 0) {
        FVar7 = outline->points[uVar21].y;
        (local_70->pp1).x = outline->points[uVar21].x;
        (local_70->pp1).y = FVar7;
        FVar7 = outline->points[iVar20 + 1U].y;
        (local_70->pp2).x = outline->points[iVar20 + 1U].x;
        (local_70->pp2).y = FVar7;
        local_70->linear = (FT_Int)((unrounded[iVar20 + 1U].x - unrounded[uVar21].x) + 0x20U >> 6);
        uVar25 = local_68->variation_support;
      }
      if ((uVar25 & 0x10) == 0) {
        FVar7 = outline->points[iVar20 + 2U].y;
        (local_70->pp3).x = outline->points[iVar20 + 2U].x;
        (local_70->pp3).y = FVar7;
        FVar7 = outline->points[iVar20 + 3U].y;
        (local_70->pp4).x = outline->points[iVar20 + 3U].x;
        (local_70->pp4).y = FVar7;
        local_70->vadvance =
             (FT_Int)((unrounded[iVar20 + 3U].y - unrounded[iVar20 + 2U].y) + 0x20U >> 6);
      }
    }
LAB_0021b424:
    pFVar19 = local_158;
    ft_mem_free(local_158,local_118);
    ft_mem_free(pFVar19,local_128);
    pFVar16 = local_100;
    pFVar28 = local_a8;
    if (local_a8 != (FT_UShort *)0xffffffffffffffff) goto LAB_0021b2a0;
  }
  else {
LAB_0021b2a0:
    ft_mem_free(local_158,pFVar28);
  }
  ft_mem_free(local_158,local_c0);
  ft_mem_free(local_158,local_b8);
  ft_mem_free(local_158,pFVar16);
  FT_Stream_ExitFrame(local_148);
  pFVar13 = local_150;
  pFVar19 = local_158;
  P = local_140;
LAB_0021b2f4:
  ft_mem_free(pFVar19,pFVar13);
  ft_mem_free(pFVar19,P);
  ft_mem_free(pFVar19,local_130);
  return error;
code_r0x0021b846:
  lVar30 = lVar30 + 1;
  lVar26 = lVar26 + 0x100000000;
  goto LAB_0021b832;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Loader    loader,
                              FT_Outline*  outline,
                              FT_Vector*   unrounded )
  {
    FT_Error   error;
    TT_Face    face        = loader->face;
    FT_Stream  stream      = face->root.stream;
    FT_Memory  memory      = stream->memory;
    FT_UInt    glyph_index = loader->glyph_index;
    FT_UInt    n_points    = (FT_UInt)outline->n_points + 4;

    FT_Vector*  points_org = NULL;  /* coordinates in 16.16 format */
    FT_Vector*  points_out = NULL;  /* coordinates in 16.16 format */
    FT_Bool*    has_delta  = NULL;

    FT_ULong  glyph_start;

    FT_UInt   tupleCount;
    FT_ULong  offsetToData;
    FT_ULong  dataSize;

    FT_ULong  here;
    FT_UInt   i, j;

    FT_Fixed*  tuple_coords    = NULL;
    FT_Fixed*  im_start_coords = NULL;
    FT_Fixed*  im_end_coords   = NULL;

    GX_Blend  blend = face->blend;

    FT_UInt  point_count;
    FT_UInt  spoint_count = 0;

    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;

    FT_Fixed*  deltas_x       = NULL;
    FT_Fixed*  deltas_y       = NULL;
    FT_Fixed*  point_deltas_x = NULL;
    FT_Fixed*  point_deltas_y = NULL;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x = INT_TO_F26DOT6( outline->points[i].x );
      unrounded[i].y = INT_TO_F26DOT6( outline->points[i].y );
    }

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for glyph %d\n", glyph_index ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    dataSize = blend->glyphoffsets[glyph_index + 1] -
                 blend->glyphoffsets[glyph_index];

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] ) ||
         FT_FRAME_ENTER( dataSize )                         )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData > dataSize                                ||
         ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 > dataSize )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    if ( FT_NEW_ARRAY( point_deltas_x, n_points ) ||
         FT_NEW_ARRAY( point_deltas_y, n_points ) )
      goto Fail3;

    for ( j = 0; j < n_points; j++ )
    {
      points_org[j].x = FT_intToFixed( outline->points[j].x );
      points_org[j].y = FT_intToFixed( outline->points[j].y );
    }

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail3;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          blend->tuplecoords +
            ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) * blend->num_axis,
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Fixed  point_delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Fixed  point_delta_y = FT_MulFix( deltas_y[j], apply );


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Pos  point_delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  point_delta_y = points_out[j].y - points_org[j].y;


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

    /* To avoid double adjustment of advance width or height, */
    /* do not move phantom points if there is HVAR or VVAR    */
    /* support, respectively.                                 */
    if ( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE )
    {
      point_deltas_x[n_points - 4] = 0;
      point_deltas_y[n_points - 4] = 0;
      point_deltas_x[n_points - 3] = 0;
      point_deltas_y[n_points - 3] = 0;
    }
    if ( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE )
    {
      point_deltas_x[n_points - 2] = 0;
      point_deltas_y[n_points - 2] = 0;
      point_deltas_x[n_points - 1] = 0;
      point_deltas_y[n_points - 1] = 0;
    }

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x += FT_fixedToFdot6( point_deltas_x[i] );
      unrounded[i].y += FT_fixedToFdot6( point_deltas_y[i] );

      outline->points[i].x += FT_fixedToInt( point_deltas_x[i] );
      outline->points[i].y += FT_fixedToInt( point_deltas_y[i] );
    }

    /* To avoid double adjustment of advance width or height, */
    /* adjust phantom points only if there is no HVAR or VVAR */
    /* support, respectively.                                 */
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE ) )
    {
      loader->pp1      = outline->points[n_points - 4];
      loader->pp2      = outline->points[n_points - 3];
      loader->linear   = FT_PIX_ROUND( unrounded[n_points - 3].x -
                                       unrounded[n_points - 4].x ) / 64;
    }
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE ) )
    {
      loader->pp3      = outline->points[n_points - 2];
      loader->pp4      = outline->points[n_points - 1];
      loader->vadvance = FT_PIX_ROUND( unrounded[n_points - 1].y -
                                       unrounded[n_points - 2].y ) / 64;
    }

  Fail3:
    FT_FREE( point_deltas_x );
    FT_FREE( point_deltas_y );

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }